

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O1

uint64_t aom_sum_squares_2d_i16_4xn_sse2(int16_t *src,int stride,int height)

{
  int iVar1;
  int iVar4;
  int iVar5;
  undefined1 auVar2 [16];
  int iVar6;
  undefined1 auVar3 [16];
  undefined1 auVar7 [16];
  
  iVar1 = 0;
  auVar2 = (undefined1  [16])0x0;
  do {
    auVar7._8_8_ = *(undefined8 *)(src + stride);
    auVar7._0_8_ = *(undefined8 *)src;
    auVar7 = pmaddwd(auVar7,auVar7);
    iVar4 = auVar2._4_4_;
    iVar5 = auVar2._8_4_;
    iVar6 = auVar2._12_4_;
    auVar3._8_8_ = *(undefined8 *)(src + stride * 3);
    auVar3._0_8_ = *(undefined8 *)(src + stride * 2);
    auVar3 = pmaddwd(auVar3,auVar3);
    auVar2._0_4_ = auVar3._0_4_ + auVar7._0_4_ + auVar2._0_4_;
    auVar2._4_4_ = auVar3._4_4_ + auVar7._4_4_ + iVar4;
    auVar2._8_4_ = auVar3._8_4_ + auVar7._8_4_ + iVar5;
    auVar2._12_4_ = auVar3._12_4_ + auVar7._12_4_ + iVar6;
    iVar1 = iVar1 + 4;
    src = src + stride * 4;
  } while (iVar1 < height);
  return SUB168(auVar2 & _DAT_00c1e380,8) + (auVar2._8_8_ >> 0x20) +
         SUB168(auVar2 & _DAT_00c1e380,0) + (ulong)auVar2._4_4_;
}

Assistant:

uint64_t aom_sum_squares_2d_i16_4xn_sse2(const int16_t *src, int stride,
                                         int height) {
  int r = 0;
  __m128i v_acc_q = _mm_setzero_si128();
  do {
    const __m128i v_acc_d = sum_squares_i16_4x4_sse2(src, stride);
    v_acc_q = _mm_add_epi32(v_acc_q, v_acc_d);
    src += stride << 2;
    r += 4;
  } while (r < height);
  const __m128i v_zext_mask_q = _mm_set1_epi64x(~0u);
  __m128i v_acc_64 = _mm_add_epi64(_mm_srli_epi64(v_acc_q, 32),
                                   _mm_and_si128(v_acc_q, v_zext_mask_q));
  v_acc_64 = _mm_add_epi64(v_acc_64, _mm_srli_si128(v_acc_64, 8));
  return xx_cvtsi128_si64(v_acc_64);
}